

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O3

void Am_Default_Pop_Up_Window_Destroy_Method_proc(Am_Object *window)

{
  bool bVar1;
  Am_Object local_20;
  Am_Value local_18;
  
  bVar1 = Am_Object::Valid(window);
  if (bVar1) {
    Am_Object::Am_Object(&local_20,window);
    Am_Value::Am_Value(&local_18,&Am_No_Value);
    Am_Finish_Pop_Up_Waiting(&local_20,&local_18);
    Am_Value::~Am_Value(&local_18);
    Am_Object::~Am_Object(&local_20);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void,
                 Am_Default_Pop_Up_Window_Destroy_Method, (Am_Object window))
{
  if (window.Valid())
    Am_Finish_Pop_Up_Waiting(window, Am_No_Value);
}